

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_eori_to_sr(m68k_info *info)

{
  uint imm;
  
  imm = read_imm_16(info);
  build_imm_special_reg(info,0x51,imm,2,M68K_REG_SR);
  return;
}

Assistant:

static void d68000_eori_to_sr(m68k_info *info)
{
	build_imm_special_reg(info, M68K_INS_EORI, read_imm_16(info), 2, M68K_REG_SR);
}